

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath *
testing::internal::FilePath::GenerateUniqueFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,char *extension)

{
  int number_00;
  bool bVar1;
  FilePath local_50;
  int local_30;
  undefined1 local_29;
  int number;
  char *extension_local;
  FilePath *base_name_local;
  FilePath *directory_local;
  FilePath *full_pathname;
  
  local_29 = 0;
  _number = extension;
  extension_local = (char *)base_name;
  base_name_local = directory;
  directory_local = __return_storage_ptr__;
  FilePath(__return_storage_ptr__);
  local_30 = 0;
  do {
    number_00 = local_30;
    local_30 = local_30 + 1;
    MakeFileName(&local_50,base_name_local,(FilePath *)extension_local,number_00,_number);
    Set(__return_storage_ptr__,&local_50);
    ~FilePath(&local_50);
    bVar1 = FileOrDirectoryExists(__return_storage_ptr__);
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::GenerateUniqueFileName(const FilePath& directory,
                                          const FilePath& base_name,
                                          const char* extension) {
  FilePath full_pathname;
  int number = 0;
  do {
    full_pathname.Set(MakeFileName(directory, base_name, number++, extension));
  } while (full_pathname.FileOrDirectoryExists());
  return full_pathname;
}